

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess_test.cc
# Opt level: O0

void __thiscall
RegisterSubprocessTestInterruptParentWithSigTerm::RegisterSubprocessTestInterruptParentWithSigTerm
          (RegisterSubprocessTestInterruptParentWithSigTerm *this)

{
  RegisterSubprocessTestInterruptParentWithSigTerm *this_local;
  
  RegisterTest(SubprocessTestInterruptParentWithSigTerm::Create,
               "SubprocessTest.InterruptParentWithSigTerm");
  return;
}

Assistant:

TEST_F(SubprocessTest, InterruptParentWithSigTerm) {
  Subprocess* subproc = subprocs_.Add("kill -TERM $PPID ; sleep 1");
  ASSERT_NE((Subprocess *) 0, subproc);

  while (!subproc->Done()) {
    bool interrupted = subprocs_.DoWork();
    if (interrupted)
      return;
  }

  ASSERT_FALSE("We should have been interrupted");
}